

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void kj::Arena::
     destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
               (void *pointer)

{
  int *piVar1;
  
  if (*(char *)((long)pointer + 8) == '\0') {
    piVar1 = *pointer;
    if ((char)piVar1[0x24] == '\x01') {
      *(undefined1 *)(piVar1 + 0x24) = 0;
    }
    if (1 < *piVar1) {
      *piVar1 = 1;
    }
  }
  return;
}

Assistant:

inline ~Deferred() noexcept(false) { if (!canceled) func(); }